

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_tailcall(HSQUIRRELVM v,SQInteger nparams)

{
  SQClosure *closure;
  bool bVar1;
  SQObjectPtr *pSVar2;
  char *err;
  
  pSVar2 = SQVM::GetUp(v,~nparams);
  if ((pSVar2->super_SQObject)._type == OT_CLOSURE) {
    closure = (pSVar2->super_SQObject)._unVal.pClosure;
    if (closure->_function->_bgenerator != true) {
      bVar1 = SQVM::TailCall(v,closure,v->_top - (v->_stackbase + nparams),nparams);
      return (ulong)(bVar1 - 1) | 0xfffffffffffffcf7;
    }
    err = "generators cannot be tail called";
  }
  else {
    err = "only closure can be tail called";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_tailcall(HSQUIRRELVM v, SQInteger nparams)
{
	SQObjectPtr &res = v->GetUp(-(nparams + 1));
	if (sq_type(res) != OT_CLOSURE) {
		return sq_throwerror(v, _SC("only closure can be tail called"));
	}
	SQClosure *clo = _closure(res);
	if (clo->_function->_bgenerator)
	{
		return sq_throwerror(v, _SC("generators cannot be tail called"));
	}
	
	SQInteger stackbase = (v->_top - nparams) - v->_stackbase;
	if (!v->TailCall(clo, stackbase, nparams)) {
		return SQ_ERROR;
	}
	return SQ_TAILCALL_FLAG;
}